

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O3

void __thiscall
rw_executor<booster::shared_mutex>::operator()(rw_executor<booster::shared_mutex> *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x14;
  do {
    if (this->read == true) {
      booster::shared_mutex::shared_lock();
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)this->flags_mutex);
      if (iVar1 != 0) {
LAB_00109427:
        std::__throw_system_error(iVar1);
      }
      *this->flag = true;
      pthread_mutex_unlock((pthread_mutex_t *)this->flags_mutex);
      booster::ptime::millisleep(5);
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)this->flags_mutex);
      if (iVar1 != 0) goto LAB_00109427;
      *this->flag = false;
      pthread_mutex_unlock((pthread_mutex_t *)this->flags_mutex);
    }
    else {
      booster::shared_mutex::unique_lock();
      *this->flag = true;
      booster::ptime::millisleep(5);
      *this->flag = false;
    }
    booster::shared_mutex::unlock();
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void operator()() const
	{
		for(int i=0;i<20;i++) {
			if(read) {
				mutex->shared_lock();
				{
					flags_mutex->lock();
					*flag = true;
					flags_mutex->unlock();
				}
				booster::ptime::millisleep(5);
				{
					flags_mutex->lock();
					*flag = false;
					flags_mutex->unlock();
				}
				mutex->unlock();
			}
			else {
				mutex->unique_lock();
				*flag = true;
				booster::ptime::millisleep(5);
				*flag = false;
				mutex->unlock();
			}
		}
	}